

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,TextureFormat *texformat)

{
  allocator<char> local_1a;
  undefined1 local_19;
  tinyusdz *local_18;
  TextureFormat *texformat_local;
  string *s;
  
  local_19 = 0;
  local_18 = this;
  texformat_local = (TextureFormat *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"[InvalidTextureFormat]",(allocator *)&local_1a);
  ::std::allocator<char>::~allocator(&local_1a);
  switch(*(undefined4 *)local_18) {
  case 0:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"automatic");
    break;
  case 1:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"latlong");
    break;
  case 2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mirroedBall");
    break;
  case 3:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"angular");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const DomeLight::TextureFormat &texformat) {
  std::string s = "[InvalidTextureFormat]";

  switch (texformat) {
    case DomeLight::TextureFormat::Automatic: {
      s = "automatic";
      break;
    }
    case DomeLight::TextureFormat::Latlong: {
      s = "latlong";
      break;
    }
    case DomeLight::TextureFormat::MirroredBall: {
      s = "mirroedBall";
      break;
    }
    case DomeLight::TextureFormat::Angular: {
      s = "angular";
      break;
    }
  }

  return s;
}